

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

void __thiscall S2Polyline::Encode(S2Polyline *this,Encoder *encoder)

{
  type src;
  Encoder *encoder_local;
  S2Polyline *this_local;
  
  Encoder::Ensure(encoder,(long)this->num_vertices_ * 0x18 + 10);
  Encoder::put8(encoder,'\x01');
  Encoder::put32(encoder,this->num_vertices_);
  src = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                  (&this->vertices_,0);
  Encoder::putn(encoder,src,(long)this->num_vertices_ * 0x18);
  Encoder::avail(encoder);
  return;
}

Assistant:

void S2Polyline::Encode(Encoder* const encoder) const {
  encoder->Ensure(num_vertices_ * sizeof(vertices_[0]) + 10);  // sufficient

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  encoder->put32(num_vertices_);
  encoder->putn(&vertices_[0], sizeof(vertices_[0]) * num_vertices_);

  S2_DCHECK_GE(encoder->avail(), 0);
}